

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

CURLcode ws_cw_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  ssize_t sVar5;
  size_t sVar6;
  char *fmt;
  ws_decoder *dec;
  bufq *q;
  CURLcode result;
  websocket *local_58;
  ws_cw_dec_ctx pass_ctx;
  
  if (((type & 1U) == 0) || (((data->set).field_0x8a2 & 0x80) != 0)) {
    CVar4 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar4;
  }
  pvVar1 = writer->ctx;
  local_58 = (websocket *)Curl_conn_meta_get(data->conn,"meta:proto:ws:conn");
  if (local_58 == (websocket *)0x0) {
    Curl_failf(data,"WS: not a websocket transfer");
    return CURLE_FAILED_INIT;
  }
  if ((nbytes == 0) ||
     (sVar5 = Curl_bufq_write((bufq *)((long)pvVar1 + 0x20),(uchar *)buf,nbytes,&result), -1 < sVar5
     )) {
    q = (bufq *)((long)pvVar1 + 0x20);
    dec = &local_58->dec;
    do {
      _Var3 = Curl_bufq_is_empty(q);
      if (_Var3) {
        if (-1 < (char)type) {
          return CURLE_OK;
        }
        _Var3 = Curl_bufq_is_empty(q);
        if (_Var3) {
          return CURLE_OK;
        }
        if (data == (Curl_easy *)0x0) {
          return CURLE_RECV_ERROR;
        }
        if (((data->set).field_0x89f & 0x40) == 0) {
          return CURLE_RECV_ERROR;
        }
        pcVar2 = (data->state).feat;
        if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
          return CURLE_RECV_ERROR;
        }
        sVar6 = Curl_bufq_len(q);
        Curl_infof(data,"WS: decode ending with %zd frame bytes remaining",sVar6);
        return CURLE_RECV_ERROR;
      }
      pass_ctx.ws = local_58;
      pass_ctx.next_writer = writer->next;
      pass_ctx.data = data;
      pass_ctx.cw_type = type;
      result = ws_dec_pass(dec,data,q,ws_cw_dec_next,&pass_ctx);
    } while (result == CURLE_OK);
    if (result == CURLE_AGAIN) {
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x89f & 0x40) == 0) {
        return CURLE_OK;
      }
      pcVar2 = (data->state).feat;
      if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
        return CURLE_OK;
      }
      if (Curl_trc_feat_write.log_level < 1) {
        return CURLE_OK;
      }
      Curl_trc_write(data,"websocket, buffered incomplete frame head");
      return CURLE_OK;
    }
    if (data == (Curl_easy *)0x0) {
      return result;
    }
    if (((data->set).field_0x89f & 0x40) == 0) {
      return result;
    }
    pcVar2 = (data->state).feat;
    if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
      return result;
    }
    fmt = "WS: decode error %d";
  }
  else {
    if (((data->set).field_0x89f & 0x40) == 0) {
      return result;
    }
    pcVar2 = (data->state).feat;
    if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
      return result;
    }
    fmt = "WS: error adding data to buffer %d";
  }
  Curl_infof(data,fmt,(ulong)result);
  return result;
}

Assistant:

static CURLcode ws_cw_write(struct Curl_easy *data,
                            struct Curl_cwriter *writer, int type,
                            const char *buf, size_t nbytes)
{
  struct ws_cw_ctx *ctx = writer->ctx;
  struct websocket *ws;
  CURLcode result;

  if(!(type & CLIENTWRITE_BODY) || data->set.ws_raw_mode)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
  if(!ws) {
    failf(data, "WS: not a websocket transfer");
    return CURLE_FAILED_INIT;
  }

  if(nbytes) {
    ssize_t nwritten;
    nwritten = Curl_bufq_write(&ctx->buf, (const unsigned char *)buf,
                               nbytes, &result);
    if(nwritten < 0) {
      infof(data, "WS: error adding data to buffer %d", result);
      return result;
    }
  }

  while(!Curl_bufq_is_empty(&ctx->buf)) {
    struct ws_cw_dec_ctx pass_ctx;
    pass_ctx.data = data;
    pass_ctx.ws = ws;
    pass_ctx.next_writer = writer->next;
    pass_ctx.cw_type = type;
    result = ws_dec_pass(&ws->dec, data, &ctx->buf,
                         ws_cw_dec_next, &pass_ctx);
    if(result == CURLE_AGAIN) {
      /* insufficient amount of data, keep it for later.
       * we pretend to have written all since we have a copy */
      CURL_TRC_WRITE(data, "websocket, buffered incomplete frame head");
      return CURLE_OK;
    }
    else if(result) {
      infof(data, "WS: decode error %d", (int)result);
      return result;
    }
  }

  if((type & CLIENTWRITE_EOS) && !Curl_bufq_is_empty(&ctx->buf)) {
    infof(data, "WS: decode ending with %zd frame bytes remaining",
          Curl_bufq_len(&ctx->buf));
    return CURLE_RECV_ERROR;
  }

  return CURLE_OK;
}